

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckMemberFunctions.cxx
# Opt level: O0

bool __thiscall kws::Parser::CheckMemberFunctions(Parser *this,char *regEx,unsigned_long maxLength)

{
  undefined8 uVar1;
  undefined1 auVar2 [8];
  bool bVar3;
  byte bVar4;
  _Ios_Openmode _Var5;
  char *pcVar6;
  ostream *poVar7;
  size_t *psVar8;
  size_t sVar9;
  reference pbVar10;
  long lVar11;
  undefined1 *puVar12;
  ulong in_RDX;
  char *in_RSI;
  long in_RDI;
  char *temp_1;
  size_t length_1;
  Error error_3;
  size_t lclose_1;
  size_t lopen_1;
  size_t close_1;
  size_t open_1;
  Error error_2;
  string functionLine;
  string destructor_1;
  string functionName;
  size_t pos3;
  size_t i_3;
  size_t i_2;
  bool valid;
  size_t pos2;
  size_t pos;
  string classname_2;
  const_iterator it;
  char *temp;
  size_t length;
  Error error_1;
  size_t lclose;
  size_t lopen;
  size_t close;
  size_t semicolon;
  size_t open;
  Error error;
  string destructor;
  size_t i_1;
  string classname_1;
  string memberFunction;
  size_t current;
  size_t classpos;
  size_t i;
  string classname;
  size_t classpos_1;
  string buffer;
  char *buf;
  unsigned_long fileSize;
  ifstream file;
  string headerfile;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  classes;
  RegularExpression regex;
  bool hasError;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff1f8;
  RegularExpression *in_stack_fffffffffffff200;
  value_type *in_stack_fffffffffffff208;
  RegularExpression *in_stack_fffffffffffff210;
  size_type in_stack_fffffffffffff218;
  undefined1 withoutComments;
  size_t in_stack_fffffffffffff220;
  Parser *in_stack_fffffffffffff228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff230;
  unsigned_long in_stack_fffffffffffff238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff240;
  Parser *in_stack_fffffffffffff248;
  pointer in_stack_fffffffffffff250;
  undefined7 in_stack_fffffffffffff258;
  undefined1 in_stack_fffffffffffff25f;
  Parser *in_stack_fffffffffffff260;
  string *in_stack_fffffffffffff268;
  allocator *paVar13;
  string *in_stack_fffffffffffff2b8;
  size_t in_stack_fffffffffffff2c0;
  size_t in_stack_fffffffffffff2c8;
  string *in_stack_fffffffffffff2d0;
  Parser *in_stack_fffffffffffff2d8;
  size_t in_stack_fffffffffffff2e0;
  Parser *in_stack_fffffffffffff2e8;
  char *in_stack_fffffffffffff300;
  Parser *in_stack_fffffffffffff308;
  size_t in_stack_fffffffffffff310;
  Parser *in_stack_fffffffffffff318;
  size_t *in_stack_fffffffffffff3b8;
  size_t in_stack_fffffffffffff3c0;
  size_t in_stack_fffffffffffff3c8;
  string *in_stack_fffffffffffff3d0;
  undefined7 in_stack_fffffffffffff3d8;
  undefined1 in_stack_fffffffffffff3df;
  string local_b28 [32];
  value_type local_b08;
  string local_ad0 [32];
  size_t local_ab0;
  Parser *local_aa8;
  undefined1 local_a99 [33];
  size_t local_a78;
  long local_a70;
  string local_a68 [32];
  undefined1 local_a48 [128];
  string local_9c8 [32];
  string local_9a8 [32];
  size_type local_988;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_980;
  byte local_969;
  undefined1 *local_968;
  undefined1 local_960 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_930;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_928;
  undefined1 local_919 [33];
  string local_8f8 [40];
  undefined1 local_8d0 [40];
  string local_8a8 [32];
  Parser *local_888;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_880;
  string local_870 [32];
  size_t local_850;
  Parser *local_848;
  allocator local_839;
  string local_838 [40];
  ulong local_810;
  ulong local_808;
  string local_800 [32];
  string local_7e0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_7c0;
  undefined1 local_7b0 [47];
  allocator local_781;
  string local_780 [32];
  string local_760 [32];
  undefined1 local_740 [16];
  string local_730 [32];
  string local_710 [32];
  string local_6f0 [32];
  long local_6d0;
  allocator local_6c1;
  string local_6c0 [32];
  undefined1 local_6a0 [40];
  string local_678 [40];
  string local_650 [32];
  string local_630 [32];
  string local_610 [32];
  size_t *local_5f0;
  string local_5e8 [39];
  allocator local_5c1;
  string local_5c0 [32];
  undefined1 local_5a0 [8];
  undefined1 local_598 [16];
  size_type local_588;
  undefined4 local_57c;
  char local_578 [527];
  allocator local_369;
  string local_368 [32];
  string local_348 [39];
  allocator local_321;
  string local_320 [32];
  string local_300 [39];
  allocator local_2d9;
  string local_2d8 [32];
  string local_2b8 [619];
  byte local_4d;
  string local_40 [32];
  ulong local_20;
  char *local_18;
  byte local_1;
  
  *(undefined1 *)(in_RDI + 0x4c) = 1;
  local_20 = in_RDX;
  local_18 = in_RSI;
  std::__cxx11::string::operator=
            ((string *)(in_RDI + 0x3d8),"Member functions should match regular expression: ");
  std::__cxx11::string::operator+=((string *)(in_RDI + 0x3d8),local_18);
  if (local_20 != 0) {
    *(undefined1 *)(in_RDI + 0x4d) = 1;
    std::__cxx11::string::operator=((string *)(in_RDI + 0x3f8),"Member functions must not exceed: ")
    ;
    std::__cxx11::to_string(in_stack_fffffffffffff238);
    std::__cxx11::string::operator+=((string *)(in_RDI + 0x3f8),local_40);
    std::__cxx11::string::~string(local_40);
    std::__cxx11::string::operator+=((string *)(in_RDI + 0x3f8)," lines");
  }
  local_4d = 0;
  kwssys::RegularExpression::RegularExpression
            (in_stack_fffffffffffff200,(char *)in_stack_fffffffffffff1f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1b9db2);
  pcVar6 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2d8,pcVar6,&local_2d9);
  kwssys::SystemTools::GetFilenameExtension((string *)in_stack_fffffffffffff248);
  bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffff200,(char *)in_stack_fffffffffffff1f8);
  std::__cxx11::string::~string(local_2b8);
  std::__cxx11::string::~string(local_2d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
  if (bVar3) {
    pcVar6 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_320,pcVar6,&local_321);
    kwssys::SystemTools::GetFilenamePath(in_stack_fffffffffffff268);
    std::__cxx11::string::~string(local_320);
    std::allocator<char>::~allocator((allocator<char> *)&local_321);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_368,pcVar6,&local_369);
    kwssys::SystemTools::GetFilenameWithoutExtension((string *)in_stack_fffffffffffff228);
    std::__cxx11::string::operator+=(local_300,local_348);
    std::__cxx11::string::~string(local_348);
    std::__cxx11::string::~string(local_368);
    std::allocator<char>::~allocator((allocator<char> *)&local_369);
    std::__cxx11::string::operator+=(local_300,".h");
    std::__cxx11::string::c_str();
    bVar3 = kwssys::SystemTools::FileExists((char *)in_stack_fffffffffffff248);
    if (bVar3) {
      std::ifstream::ifstream(local_578);
      _Var5 = std::__cxx11::string::c_str();
      std::operator|(_S_bin,_S_in);
      std::ifstream::open(local_578,_Var5);
      bVar4 = std::ifstream::is_open();
      if ((bVar4 & 1) == 0) {
        poVar7 = std::operator<<((ostream *)&std::cout,"Cannot open file: ");
        pcVar6 = (char *)std::__cxx11::string::c_str();
        poVar7 = std::operator<<(poVar7,pcVar6);
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        local_1 = 1;
        local_57c = 1;
      }
      else {
        std::istream::seekg((long)local_578,_S_beg);
        local_598 = std::istream::tellg();
        local_588 = std::fpos::operator_cast_to_long((fpos *)local_598);
        std::istream::seekg((long)local_578,_S_beg);
        local_5a0 = (undefined1  [8])operator_new__(local_588 + 1);
        std::istream::read(local_578,(long)local_5a0);
        auVar2 = local_5a0;
        *(char *)((long)local_5a0 + local_588) = '\0';
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_5c0,(char *)auVar2,&local_5c1);
        std::allocator<char>::~allocator((allocator<char> *)&local_5c1);
        std::__cxx11::string::resize((ulong)local_5c0);
        if (local_5a0 != (undefined1  [8])0x0) {
          operator_delete__((void *)local_5a0);
        }
        std::ifstream::close();
        ConvertBufferToWindowsFileType
                  (in_stack_fffffffffffff260,
                   (string *)CONCAT17(in_stack_fffffffffffff25f,in_stack_fffffffffffff258));
        std::__cxx11::string::c_str();
        RemoveComments_abi_cxx11_(in_stack_fffffffffffff308,in_stack_fffffffffffff300);
        std::__cxx11::string::operator=(local_5c0,local_5e8);
        std::__cxx11::string::~string(local_5e8);
        std::__cxx11::string::string(local_610,local_5c0);
        psVar8 = (size_t *)
                 GetClassPosition(in_stack_fffffffffffff318,in_stack_fffffffffffff310,
                                  (string *)in_stack_fffffffffffff308);
        std::__cxx11::string::~string(local_610);
        local_5f0 = psVar8;
        while (local_5f0 != (size_t *)0xffffffffffffffff) {
          std::__cxx11::string::string(local_650,local_5c0);
          FindPreviousWord(in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,
                           SUB81((ulong)in_stack_fffffffffffff2d8 >> 0x38,0),
                           in_stack_fffffffffffff2d0);
          std::__cxx11::string::~string(local_650);
          pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_5c0);
          if (*pcVar6 != ' ') {
            pcVar6 = (char *)std::__cxx11::string::operator[](in_RDI + 0x518);
            if (*pcVar6 != '\n') {
              std::__cxx11::string::operator=(local_630,"");
              local_678._32_8_ = local_5f0;
              while( true ) {
                local_678._32_8_ = local_678._32_8_ - 1;
                bVar3 = false;
                if ((size_t *)local_678._32_8_ != (size_t *)0xffffffffffffffff) {
                  in_stack_fffffffffffff3d0 =
                       (string *)std::__cxx11::string::operator[]((ulong)local_5c0);
                  bVar3 = in_stack_fffffffffffff3d0->_M_dataplus != (_Alloc_hider)0x20;
                }
                if (!bVar3) break;
                in_stack_fffffffffffff3c8 = std::__cxx11::string::operator[]((ulong)local_5c0);
                std::operator+((char)(in_stack_fffffffffffff238 >> 0x38),in_stack_fffffffffffff230);
                std::__cxx11::string::operator=(local_630,local_678);
                std::__cxx11::string::~string(local_678);
              }
              in_stack_fffffffffffff3df = 0;
            }
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffff210,(value_type *)in_stack_fffffffffffff208);
          in_stack_fffffffffffff3c0 = (long)local_5f0 + 1;
          std::__cxx11::string::string((string *)(local_6a0 + 8),local_5c0);
          in_stack_fffffffffffff3b8 =
               (size_t *)
               GetClassPosition(in_stack_fffffffffffff318,in_stack_fffffffffffff310,
                                (string *)in_stack_fffffffffffff308);
          local_5f0 = in_stack_fffffffffffff3b8;
          std::__cxx11::string::~string((string *)(local_6a0 + 8));
          std::__cxx11::string::~string(local_630);
        }
        std::__cxx11::string::~string(local_5c0);
        local_57c = 0;
      }
      std::ifstream::~ifstream(local_578);
      if (local_57c == 0) goto LAB_001ba809;
    }
    else {
LAB_001ba809:
      local_57c = 0;
    }
    std::__cxx11::string::~string(local_300);
    if (local_57c != 0) goto LAB_001bc00e;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6c0,"",&local_6c1);
  sVar9 = GetClassPosition(in_stack_fffffffffffff318,in_stack_fffffffffffff310,
                           (string *)in_stack_fffffffffffff308);
  std::__cxx11::string::~string(local_6c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6c1);
  local_6a0._0_8_ = sVar9;
  while (local_6a0._0_8_ != 0xffffffffffffffff) {
    FindEndOfClass(in_stack_fffffffffffff248,(size_t)in_stack_fffffffffffff240);
    FindMemberFunction((Parser *)CONCAT17(in_stack_fffffffffffff3df,in_stack_fffffffffffff3d8),
                       in_stack_fffffffffffff3d0,in_stack_fffffffffffff3c8,in_stack_fffffffffffff3c0
                       ,in_stack_fffffffffffff3b8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_730,"",(allocator *)(local_740 + 0xf));
    FindPreviousWord(in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,
                     SUB81((ulong)in_stack_fffffffffffff2d8 >> 0x38,0),in_stack_fffffffffffff2d0);
    std::__cxx11::string::~string(local_730);
    std::allocator<char>::~allocator((allocator<char> *)(local_740 + 0xf));
    pcVar6 = (char *)std::__cxx11::string::operator[](in_RDI + 0x518);
    if (*pcVar6 != ' ') {
      pcVar6 = (char *)std::__cxx11::string::operator[](in_RDI + 0x518);
      if (*pcVar6 != '\n') {
        std::__cxx11::string::operator=(local_710,"");
        local_740._0_8_ = local_6a0._0_8_;
        while( true ) {
          local_740._0_8_ = local_740._0_8_ - 1;
          bVar3 = false;
          if (local_740._0_8_ != 0xffffffffffffffff) {
            pcVar6 = (char *)std::__cxx11::string::operator[](in_RDI + 0x518);
            bVar3 = *pcVar6 != ' ';
          }
          if (!bVar3) break;
          std::__cxx11::string::operator[](in_RDI + 0x518);
          std::operator+((char)(in_stack_fffffffffffff238 >> 0x38),in_stack_fffffffffffff230);
          std::__cxx11::string::operator=(local_710,local_760);
          std::__cxx11::string::~string(local_760);
        }
      }
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_780,"~",&local_781);
    std::allocator<char>::~allocator((allocator<char> *)&local_781);
    std::__cxx11::string::operator+=(local_780,local_710);
    while (local_6d0 != -1) {
      bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
      if (bVar3) {
        bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
        if (bVar3) {
          bVar3 = kwssys::RegularExpression::find
                            (in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
          if (!bVar3) {
            ErrorStruct::ErrorStruct((ErrorStruct *)0x1bacfc);
            local_7c0._M_allocated_capacity =
                 GetLineNumber(in_stack_fffffffffffff228,in_stack_fffffffffffff220,
                               SUB81(in_stack_fffffffffffff218 >> 0x38,0));
            local_7b0._0_8_ = 0x1c;
            local_7c0._8_8_ = local_7c0._M_allocated_capacity;
            std::operator+((char *)in_stack_fffffffffffff248,in_stack_fffffffffffff240);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff208,(char *)in_stack_fffffffffffff200);
            std::__cxx11::string::operator=((string *)(local_7b0 + 8),local_7e0);
            std::__cxx11::string::~string(local_7e0);
            std::__cxx11::string::~string(local_800);
            std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                      ((vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_> *)
                       in_stack_fffffffffffff210,in_stack_fffffffffffff208);
            local_4d = 1;
            ErrorStruct::~ErrorStruct((ErrorStruct *)0x1badeb);
          }
          if ((local_20 != 0) && (local_6d0 != -1)) {
            local_808 = std::__cxx11::string::find((char *)(in_RDI + 0x518),0x1d7c9a);
            local_810 = std::__cxx11::string::find((char *)(in_RDI + 0x518),0x1e54be);
            if (local_808 < local_810) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_838,"",&local_839);
              sVar9 = FindClosingChar(in_stack_fffffffffffff2d8,
                                      (char)((ulong)in_stack_fffffffffffff2d0 >> 0x38),
                                      (char)((ulong)in_stack_fffffffffffff2d0 >> 0x30),
                                      in_stack_fffffffffffff2c8,
                                      SUB81(in_stack_fffffffffffff2c0 >> 0x38,0),
                                      in_stack_fffffffffffff2b8);
              std::__cxx11::string::~string(local_838);
              std::allocator<char>::~allocator((allocator<char> *)&local_839);
              local_838._32_8_ = sVar9;
              in_stack_fffffffffffff318 =
                   (Parser *)
                   GetLineNumber(in_stack_fffffffffffff228,in_stack_fffffffffffff220,
                                 SUB81(in_stack_fffffffffffff218 >> 0x38,0));
              local_848 = in_stack_fffffffffffff318;
              in_stack_fffffffffffff310 =
                   GetLineNumber(in_stack_fffffffffffff228,in_stack_fffffffffffff220,
                                 SUB81(in_stack_fffffffffffff218 >> 0x38,0));
              local_850 = in_stack_fffffffffffff310;
              if (((local_808 != 0xffffffffffffffff) && (local_838._32_8_ != 0xffffffffffffffff)) &&
                 (local_20 < in_stack_fffffffffffff310 - (long)local_848)) {
                ErrorStruct::ErrorStruct((ErrorStruct *)0x1bb051);
                in_stack_fffffffffffff308 =
                     (Parser *)
                     GetLineNumber(in_stack_fffffffffffff228,in_stack_fffffffffffff220,
                                   SUB81(in_stack_fffffffffffff218 >> 0x38,0));
                local_880._8_8_ = 0x1d;
                local_888 = in_stack_fffffffffffff308;
                local_880._M_allocated_capacity = (size_type)in_stack_fffffffffffff308;
                std::operator+((char *)in_stack_fffffffffffff248,in_stack_fffffffffffff240);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffff208,(char *)in_stack_fffffffffffff200);
                std::__cxx11::string::operator=(local_870,local_8a8);
                std::__cxx11::string::~string(local_8a8);
                std::__cxx11::string::~string((string *)(local_8d0 + 8));
                local_8d0._0_8_ = 10;
                local_8f8._32_8_ = operator_new__(10);
                snprintf((char *)local_8f8._32_8_,10,"%zd",local_850 - (long)local_848);
                std::__cxx11::string::operator+=(local_870,(char *)local_8f8._32_8_);
                std::__cxx11::string::operator+=(local_870," (");
                snprintf((char *)local_8f8._32_8_,10,"%ld",local_20);
                std::__cxx11::string::operator+=(local_870,(char *)local_8f8._32_8_);
                std::__cxx11::string::operator+=(local_870,")");
                std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                          ((vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_> *)
                           in_stack_fffffffffffff210,in_stack_fffffffffffff208);
                local_4d = 1;
                if ((char *)local_8f8._32_8_ != (char *)0x0) {
                  operator_delete__((void *)local_8f8._32_8_);
                }
                ErrorStruct::~ErrorStruct((ErrorStruct *)0x1bb23e);
              }
            }
          }
        }
      }
      in_stack_fffffffffffff2d8 = (Parser *)(in_RDI + 0x518);
      in_stack_fffffffffffff2e0 = local_6d0 + 1;
      in_stack_fffffffffffff2e8 =
           (Parser *)FindEndOfClass(in_stack_fffffffffffff248,(size_t)in_stack_fffffffffffff240);
      FindMemberFunction((Parser *)CONCAT17(in_stack_fffffffffffff3df,in_stack_fffffffffffff3d8),
                         in_stack_fffffffffffff3d0,in_stack_fffffffffffff3c8,
                         in_stack_fffffffffffff3c0,in_stack_fffffffffffff3b8);
      std::__cxx11::string::operator=(local_6f0,local_8f8);
      std::__cxx11::string::~string(local_8f8);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff210,(value_type *)in_stack_fffffffffffff208);
    in_stack_fffffffffffff2c8 = local_6a0._0_8_ + 1;
    in_stack_fffffffffffff2d0 = (string *)local_919;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_919 + 1),"",(allocator *)in_stack_fffffffffffff2d0);
    in_stack_fffffffffffff2c0 =
         GetClassPosition(in_stack_fffffffffffff318,in_stack_fffffffffffff310,
                          (string *)in_stack_fffffffffffff308);
    local_6a0._0_8_ = in_stack_fffffffffffff2c0;
    std::__cxx11::string::~string((string *)(local_919 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_919);
    std::__cxx11::string::~string(local_780);
    std::__cxx11::string::~string(local_710);
    std::__cxx11::string::~string(local_6f0);
  }
  local_930 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffff1f8);
  __gnu_cxx::
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::__normal_iterator<std::__cxx11::string*>
            ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffff200,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffff1f8);
  while( true ) {
    local_960._40_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffff1f8);
    bVar3 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffff200,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffff1f8);
    if (!bVar3) break;
    pbVar10 = __gnu_cxx::
              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator*(&local_928);
    std::__cxx11::string::string((string *)(local_960 + 8),(string *)pbVar10);
    local_960._0_8_ = std::__cxx11::string::find((string *)(in_RDI + 0x518),(ulong)(local_960 + 8));
    while ((string *)local_960._0_8_ != (string *)0xffffffffffffffff) {
      local_968 = (undefined1 *)std::__cxx11::string::find((char *)(in_RDI + 0x518),0x1e6614);
      local_969 = 0;
      if (local_968 != (undefined1 *)0xffffffffffffffff) {
        local_969 = 1;
        in_stack_fffffffffffff2b8 = (string *)local_960._0_8_;
        lVar11 = std::__cxx11::string::size();
        for (local_980._8_8_ = &in_stack_fffffffffffff2b8->_M_dataplus + lVar11;
            (ulong)local_980._8_8_ < local_968; local_980._8_8_ = local_980._8_8_ + 1) {
          pcVar6 = (char *)std::__cxx11::string::operator[](in_RDI + 0x518);
          if (*pcVar6 != ' ') {
            pcVar6 = (char *)std::__cxx11::string::operator[](in_RDI + 0x518);
            if (*pcVar6 != '\n') {
              pcVar6 = (char *)std::__cxx11::string::operator[](in_RDI + 0x518);
              if (*pcVar6 != '\r') {
                local_969 = 0;
                break;
              }
            }
          }
        }
      }
      if ((local_969 & 1) != 0) {
        local_980._M_allocated_capacity = (size_type)(local_968 + 2);
        while( true ) {
          uVar1 = local_980._M_allocated_capacity;
          puVar12 = (undefined1 *)std::__cxx11::string::size();
          bVar3 = false;
          if ((ulong)uVar1 < puVar12) {
            pcVar6 = (char *)std::__cxx11::string::operator[](in_RDI + 0x518);
            bVar3 = true;
            if (*pcVar6 != ' ') {
              pcVar6 = (char *)std::__cxx11::string::operator[](in_RDI + 0x518);
              bVar3 = true;
              if (*pcVar6 != '\n') {
                pcVar6 = (char *)std::__cxx11::string::operator[](in_RDI + 0x518);
                bVar3 = *pcVar6 == '\r';
              }
            }
          }
          if (!bVar3) break;
          local_980._M_allocated_capacity = local_980._M_allocated_capacity + 1;
        }
        local_988 = std::__cxx11::string::find((char *)(in_RDI + 0x518),0x1e54ca);
        if (local_988 != 0xffffffffffffffff) {
          std::__cxx11::string::substr((ulong)local_9a8,in_RDI + 0x518);
          paVar13 = (allocator *)(local_a48 + 0x7f);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_9c8,"~",paVar13);
          std::allocator<char>::~allocator((allocator<char> *)(local_a48 + 0x7f));
          std::__cxx11::string::operator+=(local_9c8,(string *)(local_960 + 8));
          GetLineNumber(in_stack_fffffffffffff228,in_stack_fffffffffffff220,
                        SUB81(in_stack_fffffffffffff218 >> 0x38,0));
          GetLine_abi_cxx11_((Parser *)CONCAT17(in_stack_fffffffffffff25f,in_stack_fffffffffffff258)
                             ,(unsigned_long)in_stack_fffffffffffff250);
          bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
          if (bVar3) {
            bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
            if (bVar3) {
              lVar11 = std::__cxx11::string::find(local_a48 + 0x58,0x1e6617);
              if (lVar11 == -1) {
                in_stack_fffffffffffff25f =
                     kwssys::RegularExpression::find
                               (in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
                if (!(bool)in_stack_fffffffffffff25f) {
                  ErrorStruct::ErrorStruct((ErrorStruct *)0x1bb9d2);
                  in_stack_fffffffffffff250 =
                       (pointer)GetLineNumber(in_stack_fffffffffffff228,in_stack_fffffffffffff220,
                                              SUB81(in_stack_fffffffffffff218 >> 0x38,0));
                  local_a48[0x30] = true;
                  local_a48[0x31] = false;
                  local_a48[0x32] = false;
                  local_a48[0x33] = false;
                  local_a48[0x34] = false;
                  local_a48[0x35] = false;
                  local_a48[0x36] = false;
                  local_a48[0x37] = false;
                  local_a48._32_8_ = in_stack_fffffffffffff250;
                  local_a48._40_8_ = in_stack_fffffffffffff250;
                  std::operator+((char *)in_stack_fffffffffffff248,in_stack_fffffffffffff240);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff208,(char *)in_stack_fffffffffffff200);
                  in_stack_fffffffffffff248 = (Parser *)local_a48;
                  std::__cxx11::string::operator=
                            ((string *)(local_a48 + 0x38),(string *)in_stack_fffffffffffff248);
                  std::__cxx11::string::~string((string *)in_stack_fffffffffffff248);
                  std::__cxx11::string::~string(local_a68);
                  std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                            ((vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_> *)
                             in_stack_fffffffffffff210,in_stack_fffffffffffff208);
                  local_4d = 1;
                  ErrorStruct::~ErrorStruct((ErrorStruct *)0x1bbab5);
                }
                if (local_20 != 0) {
                  local_a70 = std::__cxx11::string::find((char *)(in_RDI + 0x518),0x1d7c9a);
                  in_stack_fffffffffffff240 =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_a99;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            ((string *)(local_a99 + 1),"",(allocator *)in_stack_fffffffffffff240);
                  sVar9 = FindClosingChar(in_stack_fffffffffffff2d8,
                                          (char)((ulong)in_stack_fffffffffffff2d0 >> 0x38),
                                          (char)((ulong)in_stack_fffffffffffff2d0 >> 0x30),
                                          in_stack_fffffffffffff2c8,
                                          SUB81(in_stack_fffffffffffff2c0 >> 0x38,0),
                                          in_stack_fffffffffffff2b8);
                  std::__cxx11::string::~string((string *)(local_a99 + 1));
                  std::allocator<char>::~allocator((allocator<char> *)local_a99);
                  local_a78 = sVar9;
                  in_stack_fffffffffffff228 =
                       (Parser *)
                       GetLineNumber(in_stack_fffffffffffff228,in_stack_fffffffffffff220,
                                     SUB81(in_stack_fffffffffffff218 >> 0x38,0));
                  local_aa8 = in_stack_fffffffffffff228;
                  in_stack_fffffffffffff220 =
                       GetLineNumber(in_stack_fffffffffffff228,in_stack_fffffffffffff220,
                                     SUB81(in_stack_fffffffffffff218 >> 0x38,0));
                  withoutComments = (undefined1)(in_stack_fffffffffffff218 >> 0x38);
                  local_ab0 = in_stack_fffffffffffff220;
                  if (((local_a70 != -1) && (local_a78 != 0xffffffffffffffff)) &&
                     (local_20 < in_stack_fffffffffffff220 - (long)local_aa8)) {
                    ErrorStruct::ErrorStruct((ErrorStruct *)0x1bbcc6);
                    in_stack_fffffffffffff218 =
                         GetLineNumber(in_stack_fffffffffffff228,in_stack_fffffffffffff220,
                                       (bool)withoutComments);
                    local_b08.description.field_2._8_8_ = 0x1d;
                    local_b08.description._M_string_length = in_stack_fffffffffffff218;
                    local_b08.description.field_2._M_allocated_capacity = in_stack_fffffffffffff218;
                    std::operator+((char *)in_stack_fffffffffffff248,in_stack_fffffffffffff240);
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)in_stack_fffffffffffff208,(char *)in_stack_fffffffffffff200);
                    in_stack_fffffffffffff208 = &local_b08;
                    std::__cxx11::string::operator=(local_ad0,(string *)in_stack_fffffffffffff208);
                    std::__cxx11::string::~string((string *)in_stack_fffffffffffff208);
                    std::__cxx11::string::~string(local_b28);
                    in_stack_fffffffffffff200 = (RegularExpression *)operator_new__(10);
                    in_stack_fffffffffffff210 = in_stack_fffffffffffff200;
                    snprintf((char *)in_stack_fffffffffffff200,10,"%zd",local_ab0 - (long)local_aa8)
                    ;
                    std::__cxx11::string::operator+=(local_ad0,(char *)in_stack_fffffffffffff200);
                    std::__cxx11::string::operator+=(local_ad0," (");
                    snprintf((char *)in_stack_fffffffffffff200,10,"%ld",local_20);
                    std::__cxx11::string::operator+=(local_ad0,(char *)in_stack_fffffffffffff200);
                    std::__cxx11::string::operator+=(local_ad0,")");
                    std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                              ((vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_> *)
                               in_stack_fffffffffffff210,in_stack_fffffffffffff208);
                    local_4d = 1;
                    if (in_stack_fffffffffffff200 != (RegularExpression *)0x0) {
                      operator_delete__(in_stack_fffffffffffff200);
                    }
                    ErrorStruct::~ErrorStruct((ErrorStruct *)0x1bbe9b);
                  }
                }
              }
            }
          }
          std::__cxx11::string::~string((string *)(local_a48 + 0x58));
          std::__cxx11::string::~string(local_9c8);
          std::__cxx11::string::~string(local_9a8);
        }
      }
      local_960._0_8_ =
           std::__cxx11::string::find((string *)(in_RDI + 0x518),(ulong)(local_960 + 8));
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffff208,(int)((ulong)in_stack_fffffffffffff200 >> 0x20));
    std::__cxx11::string::~string((string *)(local_960 + 8));
  }
  local_1 = (local_4d ^ 0xff) & 1;
  local_57c = 1;
LAB_001bc00e:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffff210);
  kwssys::RegularExpression::~RegularExpression(in_stack_fffffffffffff200);
  return (bool)(local_1 & 1);
}

Assistant:

bool Parser::CheckMemberFunctions(const char* regEx,unsigned long maxLength)
{
  m_TestsDone[MEMBERFUNCTION_REGEX] = true;
  m_TestsDescription[MEMBERFUNCTION_REGEX] = "Member functions should match regular expression: ";
  m_TestsDescription[MEMBERFUNCTION_REGEX] += regEx;

  if(maxLength>0)
    {
    m_TestsDone[MEMBERFUNCTION_LENGTH] = true;
    m_TestsDescription[MEMBERFUNCTION_LENGTH] = "Member functions must not exceed: ";
    m_TestsDescription[MEMBERFUNCTION_LENGTH] += std::to_string(maxLength);
    m_TestsDescription[MEMBERFUNCTION_LENGTH] += " lines";
    }

  // First we need to find the parameters
  bool hasError = false;

  kwssys::RegularExpression regex(regEx);

  // Construct the list of classnames to check
  std::vector<std::string> classes;

  // We first read the .h if any and not a .h file
  if(kwssys::SystemTools::GetFilenameExtension(m_Filename.c_str()) != ".h")
    {
    std::string headerfile = kwssys::SystemTools::GetFilenamePath(m_Filename.c_str());
    //headerfile += "/";
    headerfile += kwssys::SystemTools::GetFilenameWithoutExtension(m_Filename.c_str());
    headerfile += ".h";

    if(kwssys::SystemTools::FileExists(headerfile.c_str()))
      {
      // We open the file
      std::ifstream file;
      file.open(headerfile.c_str(), std::ios::binary | std::ios::in);
      if(!file.is_open())
        {
        std::cout << "Cannot open file: " << headerfile.c_str() << std::endl;
        return true;
        }

      file.seekg(0,std::ios::end);
      unsigned long fileSize = file.tellg();
      file.seekg(0,std::ios::beg);

      char* buf = new char[fileSize+1];
      file.read(buf,fileSize);
      buf[fileSize] = 0;
      std::string buffer(buf);
      buffer.resize(fileSize);
      delete [] buf;

      file.close();

      this->ConvertBufferToWindowsFileType(buffer);
      buffer = this->RemoveComments(buffer.c_str());

      size_t classpos = this->GetClassPosition(0,buffer);
      while(classpos!=std::string::npos)
        {
        std::string classname = this->FindPreviousWord(classpos,false,buffer);
        if(buffer[classpos-1] != ' '
          && m_BufferNoComment[classpos-1] != '\n')
          {
          classname = "";
          size_t i=classpos-1;
          while(i!=std::string::npos && buffer[i] != ' ')
            {
            classname = buffer[i]+classname;
            i--;
            }
          }
        classes.push_back(classname);
        classpos = this->GetClassPosition(classpos+1,buffer);
        }
      }
    }

  // Check the current file for any classes
  // And check the name of the current files
  size_t classpos = this->GetClassPosition(0);
  while(classpos!=std::string::npos)
    {
    size_t current;
    std::string memberFunction =
            this->FindMemberFunction(m_BufferNoComment,classpos,
                                     this->FindEndOfClass(classpos+1),current);

    std::string classname = this->FindPreviousWord(classpos);

    if(m_BufferNoComment[classpos-1] != ' '
      && m_BufferNoComment[classpos-1] != '\n'
      )
      {
      classname = "";
      size_t i=classpos-1;
      while(i!=std::string::npos && m_BufferNoComment[i] != ' ')
        {
        classname = m_BufferNoComment[i]+classname;
        i--;
        }
      }
    std::string destructor = "~";
    destructor += classname;

    while(current!=std::string::npos)
      {
      // if the member function is a constructor or destructor we ignore
      if(memberFunction != classname
        && memberFunction != destructor
        )
        {
        if(!regex.find(memberFunction))
          {
          Error error;
          error.line = this->GetLineNumber(current,true);
          error.line2 = error.line;
          error.number = MEMBERFUNCTION_REGEX;
          error.description = "member function (" + memberFunction + ") doesn't match regular expression";
          m_ErrorList.push_back(error);
          hasError = true;
          }

        // Check the size of the current memberFunction
        if(maxLength>0 && current!=std::string::npos)
          {
          size_t open = m_BufferNoComment.find("{",current);
          size_t semicolon = m_BufferNoComment.find(";",current);
          if(semicolon>open)
            {
            size_t close = this->FindClosingChar('{','}',open,true);
            size_t lopen = this->GetLineNumber(open);
            size_t lclose = this->GetLineNumber(close);
            if((open!=std::string::npos) && (close!=std::string::npos) && (lclose-lopen>maxLength))
              {
              Error error;
              error.line = this->GetLineNumber(current,true);
              error.line2 = error.line;
              error.number = MEMBERFUNCTION_LENGTH;
              error.description = "function (" + memberFunction + ") has too many lines: ";
              constexpr size_t length = 10;
              char* temp = new char[length];
              snprintf(temp,length,"%zd",lclose-lopen);
              error.description += temp;
              error.description += " (";
              snprintf(temp,length,"%ld",maxLength);
              error.description += temp;
              error.description += ")";
              m_ErrorList.push_back(error);
              hasError = true;
              delete [] temp;
              }
            }
          }
        }
      memberFunction = this->FindMemberFunction(m_BufferNoComment,current+1,this->FindEndOfClass(classpos+1),current);
      }
    classes.push_back(classname);
    classpos = this->GetClassPosition(classpos+1);
    }

  // Do the checking for the implementation file
  std::vector<std::string>::const_iterator it = classes.begin();
  while(it != classes.end())
    {
    std::string classname = (*it);

    // Search all the classname::
    size_t pos = m_BufferNoComment.find(classname,0);
    while(pos != std::string::npos)
      {
      // look for ::
      size_t pos2 = m_BufferNoComment.find("::",pos);
      bool valid = false;
      if(pos2 != std::string::npos)
        {
        valid = true;
        for(size_t i=pos+classname.size();i<pos2;i++)
          {
          if(m_BufferNoComment[i] != ' ' && m_BufferNoComment[i] != '\n' && m_BufferNoComment[i] != '\r')
            {
            valid = false;
            break;
            }
          }
        }

      // if we have a match we look for the name
      if(valid)
        {
        size_t i=pos2+2;
        while(i<m_BufferNoComment.size() &&
             (m_BufferNoComment[i] == ' '
             || m_BufferNoComment[i] == '\n'
             || m_BufferNoComment[i] == '\r'))
          {
          i++;
          }

       size_t pos3 = m_BufferNoComment.find("(",i);
       if(pos3 != std::string::npos)
         {
         std::string functionName = m_BufferNoComment.substr(i,pos3-i);
         std::string destructor = "~";
         destructor += classname;

         std::string functionLine = this->GetLine(this->GetLineNumber(i,true)-1);

         // if the member function is a constructor or destructor we ignore
         if(functionName != classname
           && functionName != destructor
           && functionLine.find("typedef ") == std::string::npos
           )
           {
           if(!regex.find(functionName))
             {
             Error error;
             error.line = this->GetLineNumber(i,true);
             error.line2 = error.line;
             error.number = MEMBERFUNCTION_REGEX;
             error.description = "function (" + functionName + ") doesn't match regular expression";
             m_ErrorList.push_back(error);
             hasError = true;
             }

           if(maxLength>0)
             {
             size_t open = m_BufferNoComment.find("{",i);
             size_t close = this->FindClosingChar('{','}',open,true);
             size_t lopen = this->GetLineNumber(open);
             size_t lclose = this->GetLineNumber(close);
             if((open!=std::string::npos) && (close!=std::string::npos)
                && (lclose-lopen>maxLength))
               {
               Error error;
               error.line = this->GetLineNumber(pos3,true);
               error.line2 = error.line;
               error.number = MEMBERFUNCTION_LENGTH;
               error.description = "function (" + functionName + ") has too many lines: ";
               constexpr size_t length = 10;
               char* temp = new char[length];
               snprintf(temp,length,"%zd",lclose-lopen);
               error.description += temp;
               error.description += " (";
               snprintf(temp,length,"%ld",maxLength);
               error.description += temp;
               error.description += ")";
               m_ErrorList.push_back(error);
               hasError = true;
               delete [] temp;
               }
             }
           }
         }
        }
      pos = m_BufferNoComment.find(classname,pos+1);
      }
    it++;
    }

  return !hasError;
}